

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-order.c
# Opt level: O0

void check_cb(uv_check_t *handle)

{
  int iVar1;
  uv_check_t *handle_local;
  
  iVar1 = uv_check_stop(&check_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-from-check.c"
            ,0x35,"0 == uv_check_stop(&check_handle)");
    abort();
  }
  iVar1 = uv_timer_stop(&timer_handle);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-from-check.c"
            ,0x36,"0 == uv_timer_stop(&timer_handle)");
    abort();
  }
  iVar1 = uv_timer_start(&timer_handle,timer_cb,0x32,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-from-check.c"
            ,0x37,"0 == uv_timer_start(&timer_handle, timer_cb, 50, 0)");
    abort();
  }
  iVar1 = uv_prepare_start(&prepare_handle,prepare_cb);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-from-check.c"
            ,0x38,"0 == uv_prepare_start(&prepare_handle, prepare_cb)");
    abort();
  }
  if (prepare_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-from-check.c"
            ,0x39,"0 == prepare_cb_called");
    abort();
  }
  if (check_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-from-check.c"
            ,0x3a,"0 == check_cb_called");
    abort();
  }
  if (timer_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-timer-from-check.c"
            ,0x3b,"0 == timer_cb_called");
    abort();
  }
  check_cb_called = 1;
  return;
}

Assistant:

static void check_cb(uv_check_t* handle) {
  ASSERT(check_cb_called == 0);
  ASSERT(timer_cb_called == 1);
  ASSERT(close_cb_called == 0);
  uv_close((uv_handle_t*) handle, close_cb);
  uv_close((uv_handle_t*) &timer_handle2, close_cb);
  check_cb_called++;
}